

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O3

void opj_dwt_calc_explicit_stepsizes(opj_tccp_t *tccp,OPJ_UINT32 prec)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  OPJ_UINT32 OVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  double dVar14;
  
  OVar1 = tccp->numresolutions;
  uVar6 = OVar1 * 3 - 2;
  if (uVar6 != 0) {
    OVar2 = tccp->qmfbid;
    OVar3 = tccp->qntsty;
    uVar13 = 0;
    do {
      uVar7 = 0;
      uVar10 = 0;
      if (uVar13 != 0) {
        uVar10 = (int)uVar13 - 1;
        uVar7 = ~(uVar10 / 3);
        uVar10 = uVar10 % 3 + 1;
      }
      iVar5 = 2 - (uint)(uVar10 - 1 < 2);
      if (uVar10 == 0) {
        iVar5 = 0;
      }
      if (OVar2 == 0) {
        iVar5 = 0;
      }
      dVar14 = 8192.0;
      if (OVar3 != 0) {
        dVar14 = ((double)(1 << ((byte)iVar5 & 0x1f)) /
                 (double)opj_dwt_norms_real[uVar10][uVar7 + (OVar1 - 1)]) * 8192.0;
      }
      dVar14 = floor(dVar14);
      uVar10 = (uint)dVar14;
      iVar8 = 0;
      uVar7 = 0;
      if (1 < (int)uVar10) {
        iVar8 = 0;
        uVar7 = uVar10;
        do {
          iVar8 = iVar8 + -1;
          bVar4 = 3 < uVar7;
          uVar7 = uVar7 >> 1;
        } while (bVar4);
        uVar7 = uVar10;
        iVar12 = -0xb;
        do {
          iVar11 = iVar12;
          iVar12 = iVar11 + 1;
          bVar4 = 3 < uVar7;
          uVar7 = uVar7 >> 1;
        } while (bVar4);
        bVar9 = (byte)iVar12;
        uVar7 = uVar10 << (-bVar9 & 0x1f);
        if (10 < iVar11 + 0xbU) {
          uVar7 = uVar10 >> (bVar9 & 0x1f);
        }
        uVar7 = uVar7 & 0x7ff;
      }
      tccp->stepsizes[uVar13].mant = uVar7;
      tccp->stepsizes[uVar13].expn = iVar5 + prec + 0xd + iVar8;
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar6);
  }
  return;
}

Assistant:

void opj_dwt_calc_explicit_stepsizes(opj_tccp_t * tccp, OPJ_UINT32 prec) {
	OPJ_UINT32 numbands, bandno;
	numbands = 3 * tccp->numresolutions - 2;
	for (bandno = 0; bandno < numbands; bandno++) {
		OPJ_FLOAT64 stepsize;
		OPJ_UINT32 resno, level, orient, gain;

		resno = (bandno == 0) ? 0 : ((bandno - 1) / 3 + 1);
		orient = (bandno == 0) ? 0 : ((bandno - 1) % 3 + 1);
		level = tccp->numresolutions - 1 - resno;
		gain = (tccp->qmfbid == 0) ? 0 : ((orient == 0) ? 0 : (((orient == 1) || (orient == 2)) ? 1 : 2));
		if (tccp->qntsty == J2K_CCP_QNTSTY_NOQNT) {
			stepsize = 1.0;
		} else {
			OPJ_FLOAT64 norm = opj_dwt_norms_real[orient][level];
			stepsize = (1 << (gain)) / norm;
		}
		opj_dwt_encode_stepsize((OPJ_INT32) floor(stepsize * 8192.0), (OPJ_INT32)(prec + gain), &tccp->stepsizes[bandno]);
	}
}